

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

Stack_Holder * __thiscall
chaiscript::detail::Dispatch_Engine::get_stack_holder(Dispatch_Engine *this)

{
  _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar1;
  Thread_Storage<chaiscript::detail::Stack_Holder> *local_10;
  
  this_00 = (_Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t();
  local_10 = &this->m_stack_holder;
  pmVar1 = std::__detail::
           _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_10);
  return pmVar1;
}

Assistant:

Stack_Holder &get_stack_holder() noexcept { return *m_stack_holder; }